

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void address_space_destroy_m68k(AddressSpace *as)

{
  MemoryRegion *mr;
  MemoryRegion *root;
  AddressSpace *as_local;
  
  mr = (MemoryRegion *)as->root;
  memory_region_transaction_begin_m68k();
  as->root = (MemoryRegion_conflict *)0x0;
  memory_region_transaction_commit_m68k(mr);
  if ((as->address_spaces_link).tqe_next == (AddressSpace *)0x0) {
    (as->uc->address_spaces).tqh_circ.tql_prev = (as->address_spaces_link).tqe_circ.tql_prev;
  }
  else {
    (((as->address_spaces_link).tqe_next)->address_spaces_link).tqe_circ.tql_prev =
         (as->address_spaces_link).tqe_circ.tql_prev;
  }
  ((as->address_spaces_link).tqe_circ.tql_prev)->tql_next = (as->address_spaces_link).tqe_next;
  (as->address_spaces_link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  (as->address_spaces_link).tqe_next = (AddressSpace *)0x0;
  (as->address_spaces_link).tqe_next = (AddressSpace *)0x0;
  as->root = (MemoryRegion_conflict *)mr;
  flatview_unref_m68k(as->current_map);
  return;
}

Assistant:

void address_space_destroy(AddressSpace *as)
{
    MemoryRegion *root = as->root;

    /* Flush out anything from MemoryListeners listening in on this */
    memory_region_transaction_begin();
    as->root = NULL;
    memory_region_transaction_commit(root);
    QTAILQ_REMOVE(&as->uc->address_spaces, as, address_spaces_link);

    /* At this point, as->dispatch and as->current_map are dummy
     * entries that the guest should never use.  Wait for the old
     * values to expire before freeing the data.
     */
    as->root = root;
    flatview_unref(as->current_map);
}